

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALboolean alIsBuffer(ALuint name)

{
  ALboolean b;
  ALboolean retval;
  ALuint name_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsBuffer);
  IO_UINT32(name);
  b = (*REAL_alIsBuffer)(name);
  IO_BOOLEAN(b);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return b;
}

Assistant:

ALboolean alIsBuffer(ALuint name)
{
    ALboolean retval;
    IO_START(alIsBuffer);
    IO_UINT32(name);
    retval = REAL_alIsBuffer(name);
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}